

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

bitset_container_t * bitset_container_from_run(run_container_t *arr)

{
  int iVar1;
  bitset_container_t *pbVar2;
  int local_24;
  rle16_t vl;
  int rlepos;
  bitset_container_t *answer;
  int card;
  run_container_t *arr_local;
  
  iVar1 = run_container_cardinality(arr);
  pbVar2 = bitset_container_create();
  for (local_24 = 0; local_24 < arr->n_runs; local_24 = local_24 + 1) {
    bitset_set_lenrange(pbVar2->words,(uint)arr->runs[local_24] & 0xffff,
                        (uint)arr->runs[local_24] >> 0x10);
  }
  pbVar2->cardinality = iVar1;
  return pbVar2;
}

Assistant:

bitset_container_t *bitset_container_from_run(const run_container_t *arr) {
    int card = run_container_cardinality(arr);
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        rle16_t vl = arr->runs[rlepos];
        bitset_set_lenrange(answer->words, vl.value, vl.length);
    }
    answer->cardinality = card;
    return answer;
}